

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Worker::CloseWhenFinished(Worker *this)

{
  std::mutex::lock(&this->mutex_);
  this->close_pending_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  Signaler::Signal(&this->signal_);
  return;
}

Assistant:

void CloseWhenFinished() {
            {
                lock_t lock(mutex_);
                close_pending_ = true;
            }
            Signal();
        }